

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

void __thiscall cfd::core::SchnorrSignature::SchnorrSignature(SchnorrSignature *this,ByteData *data)

{
  uint8_t sighash_type_value;
  bool bVar1;
  size_t sVar2;
  CfdException *pCVar3;
  allocator local_59;
  string local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&data->data_);
  SigHashType::SigHashType(&this->sighash_type_,kSigHashDefault,false,false);
  sVar2 = ByteData::GetDataSize(&this->data_);
  if (sVar2 != 0x41) {
    sVar2 = ByteData::GetDataSize(&this->data_);
    if (sVar2 == 0x40) {
      return;
    }
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_58,"Invalid Schnorr signature data.",(allocator *)&bytes);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_58);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&bytes,data);
  sighash_type_value =
       bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[0x40];
  if ((sighash_type_value != '\0') && (bVar1 = IsValidSigHashType(sighash_type_value), bVar1)) {
    SigHashType::SetFromSigHashFlag(&this->sighash_type_,sighash_type_value);
    ByteData::ByteData((ByteData *)&local_58,
                       bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0x40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_58);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_58,"Invalid Schnorr signature hash type.",&local_59);
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_58);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrSignature::SchnorrSignature(const ByteData &data)
    : data_(data), sighash_type_(SigHashAlgorithm::kSigHashDefault) {
  if (data_.GetDataSize() == SchnorrSignature::kSchnorrSignatureSize + 1) {
    auto bytes = data.GetBytes();
    uint8_t sighash_type = bytes[SchnorrSignature::kSchnorrSignatureSize];
    if ((sighash_type == 0) || (!IsValidSigHashType(sighash_type))) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid Schnorr signature hash type.");
    }
    sighash_type_.SetFromSigHashFlag(sighash_type);
    data_ = ByteData(bytes.data(), SchnorrSignature::kSchnorrSignatureSize);
  } else if (data_.GetDataSize() != SchnorrSignature::kSchnorrSignatureSize) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Schnorr signature data.");
  }
}